

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void arima_predict(arima_object obj,double *inp,int L,double *xpred,double *amse)

{
  int d_00;
  int N_00;
  int ip_00;
  int iq_00;
  double *C;
  double *W_00;
  double *resid_00;
  double *phi_00;
  double *theta_00;
  double local_90;
  double wmean;
  double *theta;
  double *phi;
  double *resid;
  double *W;
  double *delta;
  int ir;
  int iq;
  int ip;
  int N;
  int i;
  int d;
  double *amse_local;
  double *xpred_local;
  int L_local;
  double *inp_local;
  arima_object obj_local;
  
  d_00 = obj->d;
  N_00 = obj->N;
  ip_00 = obj->p;
  iq_00 = obj->q;
  C = (double *)malloc((long)(d_00 + 1) << 3);
  W_00 = (double *)malloc((long)N_00 << 3);
  resid_00 = (double *)malloc((long)N_00 << 3);
  delta._0_4_ = iq_00 + 1;
  if (iq_00 + 1 < ip_00) {
    delta._0_4_ = ip_00;
  }
  phi_00 = (double *)malloc((long)(int)delta << 3);
  theta_00 = (double *)malloc((long)(int)delta << 3);
  local_90 = 0.0;
  if (d_00 < 1) {
    *C = 1.0;
    local_90 = obj->mean;
  }
  else {
    deld(d_00,C);
  }
  for (ip = 1; ip <= d_00; ip = ip + 1) {
    C[ip] = C[ip] * -1.0;
  }
  for (ip = 0; ip < N_00; ip = ip + 1) {
    W_00[ip] = inp[ip];
    if (d_00 == 0) {
      W_00[ip] = W_00[ip] - local_90;
    }
    resid_00[ip] = obj->res[ip];
  }
  for (ip = 0; ip < (int)delta; ip = ip + 1) {
    theta_00[ip] = 0.0;
    phi_00[ip] = 0.0;
  }
  for (ip = 0; ip < ip_00; ip = ip + 1) {
    phi_00[ip] = obj->phi[ip];
  }
  for (ip = 0; ip < iq_00; ip = ip + 1) {
    theta_00[ip] = obj->theta[ip] * -1.0;
  }
  forkal(ip_00,iq_00,d_00,phi_00,theta_00,C + 1,N_00,W_00,resid_00,L,xpred,amse);
  for (ip = 0; ip < L; ip = ip + 1) {
    xpred[ip] = local_90 + xpred[ip];
  }
  free(C);
  free(W_00);
  free(resid_00);
  free(phi_00);
  free(theta_00);
  return;
}

Assistant:

void arima_predict(arima_object obj,double *inp, int L,double *xpred,double *amse) {
	int d,i,N,ip,iq,ir;
	double *delta,*W,*resid,*phi,*theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	ip = obj->p;
	iq = obj->q;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	forkal(ip, iq, d, phi, theta, delta+1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}